

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

bool __thiscall luna::Table::MoveHashToArray(Table *this,Value *key)

{
  _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  iterator __it;
  bool bVar1;
  
  this_00 = &((this->hash_)._M_t.
              super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
              .
              super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
             ._M_head_impl)->_M_h;
  if (this_00 ==
      (_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)0x0) {
    bVar1 = false;
  }
  else {
    __it = std::
           _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(this_00,key);
    bVar1 = __it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur
            != (__node_type *)0x0;
    if (bVar1) {
      AppendToArray(this,(Value *)((long)__it.
                                         super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>
                                         ._M_cur + 0x18));
      std::
      _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&((this->hash_)._M_t.
                super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
               ._M_head_impl)->_M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur
             );
    }
  }
  return bVar1;
}

Assistant:

bool Table::MoveHashToArray(const Value &key)
    {
        if (!hash_)
            return false;

        auto it = hash_->find(key);
        if (it == hash_->end())
            return false;

        AppendToArray(it->second);
        hash_->erase(it);
        return true;
    }